

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

string * __thiscall
libtorrent::lexically_relative_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,string_view base,string_view target)

{
  size_t __n;
  char *__s1;
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  aux *paVar6;
  char *pcVar7;
  aux *this_00;
  int iVar8;
  string_view last;
  string_view last_00;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_60;
  aux *local_40;
  char *local_38;
  
  pcVar7 = (char *)target._M_len;
  pcVar4 = base._M_str;
  pcVar5 = (char *)base._M_len;
  if (this == (libtorrent *)0x0) {
    paVar6 = (aux *)0x0;
  }
  else {
    paVar6 = (aux *)(this + -(ulong)((pcVar5 + -1)[(long)this] == '/'));
  }
  iVar2 = 0;
  if (pcVar4 == (char *)0x0) {
    this_00 = (aux *)0x0;
  }
  else {
    this_00 = (aux *)(pcVar4 + -(ulong)((pcVar7 + -1)[(long)pcVar4] == '/'));
  }
  pcVar4 = pcVar7;
  if (paVar6 == (aux *)0x0) {
    iVar3 = 0;
  }
  else {
    do {
      last._M_str = (char *)0x2f;
      last._M_len = (size_t)pcVar5;
      local_40 = paVar6;
      aux::split_string(&local_60,paVar6,last,(char)pcVar4);
      pcVar1 = local_60.second._M_str;
      paVar6 = (aux *)local_60.second._M_len;
      __s1 = local_60.first._M_str;
      __n = local_60.first._M_len;
      last_00._M_str = (char *)0x2f;
      last_00._M_len = (size_t)pcVar7;
      local_38 = pcVar7;
      aux::split_string(&local_60,this_00,last_00,(char)pcVar4);
      pcVar7 = local_60.second._M_str;
      this_00 = (aux *)local_60.second._M_len;
      if ((__n != local_60.first._M_len) ||
         ((__n != 0 && (iVar2 = bcmp(__s1,local_60.first._M_str,__n), iVar2 != 0)))) {
        paVar6 = (aux *)0x0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(pcVar5[(long)paVar6] == '/');
          paVar6 = paVar6 + 1;
        } while (local_40 != paVar6);
        iVar2 = 1;
        pcVar7 = local_38;
        goto LAB_002390bd;
      }
      pcVar5 = pcVar1;
    } while (paVar6 != (aux *)0x0);
    iVar3 = 0;
    iVar2 = 0;
  }
LAB_002390bd:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar8 = iVar2 + iVar3;
  if (iVar8 != 0 && SCARRY4(iVar2,iVar3) == iVar8 < 0) {
    do {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar7);
  return __return_storage_ptr__;
}

Assistant:

std::string lexically_relative(string_view base, string_view target)
	{
		// first, strip trailing directory separators
		if (!base.empty() && base.back() == TORRENT_SEPARATOR_CHAR)
			base.remove_suffix(1);
		if (!target.empty() && target.back() == TORRENT_SEPARATOR_CHAR)
			target.remove_suffix(1);

		// strip common path elements
		for (;;)
		{
			if (base.empty()) break;
			string_view prev_base = base;
			string_view prev_target = target;

			string_view base_element;
			string_view target_element;
			std::tie(base_element, base) = aux::split_string(base, TORRENT_SEPARATOR_CHAR);
			std::tie(target_element, target) = aux::split_string(target, TORRENT_SEPARATOR_CHAR);
			if (base_element == target_element) continue;

			base = prev_base;
			target = prev_target;
			break;
		}

		// count number of path elements left in base, and prepend that number of
		// "../" to target

		// base always points to a directory. There's an implied directory
		// separator at the end of it
		int const num_steps = static_cast<int>(std::count(
			base.begin(), base.end(), TORRENT_SEPARATOR_CHAR)) + (base.empty() ? 0 : 1);
		std::string ret;
		for (int i = 0; i < num_steps; ++i)
			ret += ".." TORRENT_SEPARATOR;

		ret += target;
		return ret;
	}